

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cURLpp.cpp
# Opt level: O3

char * __thiscall curlpp::getenv(curlpp *this,char *__name)

{
  char *pcVar1;
  char *__s;
  RuntimeError *this_00;
  
  *(curlpp **)this = this + 0x10;
  *(undefined8 *)(this + 8) = 0;
  this[0x10] = (curlpp)0x0;
  __s = (char *)curl_getenv(*(undefined8 *)__name);
  if (__s != (char *)0x0) {
    pcVar1 = *(char **)(this + 8);
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)__s);
    free(__s);
    return (char *)this;
  }
  this_00 = (RuntimeError *)__cxa_allocate_exception(0x10);
  RuntimeError::RuntimeError(this_00,"unable to get the environnement string");
  __cxa_throw(this_00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

std::string
curlpp::getenv(const std::string & name)
{
   std::string buffer;
   char* p = curl_getenv(name.c_str());
   if (!p)
   {
      throw RuntimeError("unable to get the environnement string"); //we got an error
   }
   else
   {
      buffer = p;
      free(p);
   }
   return buffer;
}